

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O1

size_t __thiscall
iDynTree::SubModelDecomposition::getSubModelOfLink(SubModelDecomposition *this,LinkIndex *link)

{
  long lVar1;
  pointer puVar2;
  ostream *poVar3;
  size_t sVar4;
  
  lVar1 = *link;
  if ((lVar1 < 0) ||
     (puVar2 = (this->link2subModelIndex).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
     (long)(this->link2subModelIndex).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish - (long)puVar2 >> 3 <= lVar1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"SubModelDecomposition error: requested link index ",0x32);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"outside bounds ",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    sVar4 = 0;
  }
  else {
    sVar4 = puVar2[lVar1];
  }
  return sVar4;
}

Assistant:

size_t SubModelDecomposition::getSubModelOfLink(const LinkIndex& link) const
{
    size_t ret = 0;

    if( link >= 0 &&  link < (LinkIndex) this->link2subModelIndex.size() )
    {
        ret = link2subModelIndex[link];
    }
    else
    {
        std::cerr << "SubModelDecomposition error: requested link index " << link
                  << "outside bounds " << std::endl;
    }

    return ret;
}